

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch.c
# Opt level: O3

Integer pnga_sprs_array_count_sketch
                  (Integer s_a,Integer size_k,Integer *g_k,Integer *g_w,Integer trans)

{
  long lVar1;
  long *plVar2;
  int *piVar3;
  double *pdVar4;
  size_t __size;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  double dVar8;
  Integer *pIVar9;
  double dVar10;
  DoublePrecision DVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  Integer *pIVar17;
  uint uVar18;
  Integer IVar19;
  Integer IVar20;
  void *pvVar21;
  Integer *pIVar22;
  void *pvVar23;
  Integer *pIVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  _sparse_array *p_Var29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  Integer *pIVar34;
  long lVar35;
  float fVar36;
  float fVar37;
  void *vptr;
  Integer lo [2];
  Integer hi [2];
  int *jptr;
  int *iptr;
  Integer nblocks [2];
  Integer jhi;
  Integer jlo;
  Integer *local_110;
  long local_108 [3];
  long local_f0;
  Integer *local_e8;
  Integer *local_e0;
  Integer *local_d0;
  Integer *local_c8;
  Integer *local_c0;
  Integer *local_b8;
  Integer *local_b0;
  void *local_a8;
  Integer local_a0;
  Integer *local_98;
  long local_90;
  long local_88;
  Integer local_80;
  Integer local_78 [3];
  Integer local_60;
  Integer *local_58;
  Integer *local_50;
  Integer local_40;
  Integer local_38;
  
  lVar1 = s_a + 1000;
  local_b8 = (Integer *)size_k;
  local_b0 = g_k;
  local_a0 = trans;
  local_98 = g_w;
  local_60 = s_a;
  if (SPA[lVar1].idim < size_k) {
    pnga_error("Row dimension of sketch matrix must be less than rowdimension of original matrix",
               size_k);
  }
  if (SPA[lVar1].type == 0x3f8) {
    pnga_error("Data type of sparse matrix cannot be of type long long",0x3f8);
  }
  local_f0 = SPA[lVar1].ihi - SPA[lVar1].ilo;
  pIVar34 = (Integer *)(local_f0 + 1);
  pIVar24 = (Integer *)SPA[lVar1].idim;
  pIVar9 = (Integer *)SPA[lVar1].jdim;
  local_80 = SPA[lVar1].idx_size;
  lVar35 = SPA[lVar1].type;
  IVar19 = pnga_pgroup_nnodes(SPA[lVar1].grp);
  IVar20 = pnga_pgroup_nodeid(SPA[lVar1].grp);
  local_d0 = (Integer *)(IVar19 * 8);
  pvVar21 = malloc((size_t)local_d0);
  pIVar22 = (Integer *)malloc(IVar19 * 8 + 8);
  if (0 < IVar19) {
    memset(pvVar21,0,(size_t)local_d0);
  }
  *(Integer **)((long)pvVar21 + IVar20 * 8) = pIVar34;
  pnga_pgroup_gop(SPA[lVar1].grp,(ulong)(local_80 != 4) + 0x3e9,pvVar21,IVar19,"+");
  *pIVar22 = 1;
  if (1 < IVar19) {
    lVar25 = 1;
    lVar27 = 0;
    do {
      lVar25 = lVar25 + *(long *)((long)pvVar21 + lVar27 * 8);
      pIVar22[lVar27 + 1] = lVar25;
      lVar27 = lVar27 + 1;
    } while (IVar19 + -1 != lVar27);
  }
  pIVar22[IVar19] = 1;
  local_78[1] = 1;
  local_78[2] = (long)pIVar34 * 8;
  local_d0 = pIVar22;
  local_78[0] = IVar19;
  local_a8 = malloc(local_78[2]);
  if (-1 < local_f0) {
    dVar10 = (double)(long)local_b8;
    pIVar22 = (Integer *)0x0;
    do {
      DVar11 = pnga_rand(0);
      *(long *)((long)local_a8 + (long)pIVar22 * 8) = (long)(DVar11 * dVar10);
      pIVar22 = (Integer *)((long)pIVar22 + 1);
    } while (pIVar34 != pIVar22);
  }
  pvVar21 = malloc(SPA[lVar1].size * (long)pIVar34);
  if (-1 < local_f0) {
    lVar25 = 0;
    pIVar22 = pIVar34;
    do {
      DVar11 = pnga_rand(0);
      if (lVar35 - 0x3e9U < 0x10) {
        uVar18 = -(uint)((int)(DVar11 + DVar11) == 0) | 1;
        switch(lVar35) {
        case 0x3e9:
          *(uint *)((long)pvVar21 + lVar25) = uVar18;
          break;
        case 0x3ea:
        case 0x3f8:
          *(long *)((long)pvVar21 + lVar25 * 2) = (long)(int)uVar18;
          break;
        case 0x3eb:
          *(float *)((long)pvVar21 + lVar25) = (float)(int)uVar18;
          break;
        case 0x3ec:
          *(double *)((long)pvVar21 + lVar25 * 2) = (double)(int)uVar18;
          break;
        case 0x3ee:
          *(float *)((long)pvVar21 + lVar25 * 2) = (float)(int)uVar18;
          *(undefined4 *)((long)pvVar21 + lVar25 * 2 + 4) = 0;
          break;
        case 0x3ef:
          *(double *)((long)pvVar21 + lVar25 * 4) = (double)(int)uVar18;
          *(undefined8 *)((long)pvVar21 + lVar25 * 4 + 8) = 0;
        }
      }
      lVar25 = lVar25 + 4;
      pIVar22 = (Integer *)((long)pIVar22 + -1);
    } while (pIVar22 != (Integer *)0x0);
  }
  IVar19 = pnga_create_handle();
  pIVar17 = local_98;
  *local_98 = IVar19;
  local_58 = pIVar24;
  pnga_set_data(IVar19,1,(Integer *)&local_58,SPA[lVar1].type);
  pIVar24 = local_d0;
  pnga_set_irreg_distr(*pIVar17,local_d0,local_78);
  pnga_set_pgroup(*pIVar17,SPA[lVar1].grp);
  pnga_allocate(*pIVar17);
  IVar19 = pnga_create_handle();
  pIVar22 = local_b0;
  *local_b0 = IVar19;
  pnga_set_data(IVar19,1,(Integer *)&local_58,0x3e9);
  pnga_set_irreg_distr(*pIVar22,pIVar24,local_78);
  pnga_set_pgroup(*pIVar22,SPA[lVar1].grp);
  pnga_allocate(*pIVar22);
  local_e8 = (Integer *)(SPA[lVar1].ilo + 1);
  local_c8 = (Integer *)(SPA[lVar1].ihi + 1);
  local_110 = pIVar34;
  pvVar23 = malloc((long)pIVar34 * 4);
  if (-1 < local_f0) {
    lVar25 = 0;
    do {
      *(undefined4 *)((long)pvVar23 + lVar25 * 4) = *(undefined4 *)((long)local_a8 + lVar25 * 8);
      lVar25 = lVar25 + 1;
    } while (local_f0 + 1 != lVar25);
  }
  pnga_put(*pIVar22,(Integer *)&local_e8,(Integer *)&local_c8,pvVar23,(Integer *)&local_110);
  free(pvVar23);
  pnga_put(*pIVar17,(Integer *)&local_e8,(Integer *)&local_c8,pvVar21,(Integer *)&local_110);
  pnga_pgroup_sync(SPA[lVar1].grp);
  IVar19 = pnga_create_handle();
  pIVar34 = local_b8;
  local_50 = local_b8;
  local_58 = pIVar9;
  if (local_a0 == 0) {
    local_50 = pIVar9;
    local_58 = local_b8;
  }
  pnga_set_data(IVar19,2,(Integer *)&local_58,SPA[lVar1].type);
  pnga_set_pgroup(IVar19,SPA[lVar1].grp);
  pnga_allocate(IVar19);
  pnga_zero(IVar19);
  __size = (long)pIVar34 * 8;
  pIVar24 = (Integer *)malloc(__size);
  pvVar23 = malloc(local_78[2]);
  if (0 < (long)pIVar34) {
    memset(pIVar24,0xff,__size);
  }
  if (-1 < local_f0) {
    lVar25 = 0;
    do {
      lVar27 = *(long *)((long)local_a8 + lVar25 * 8);
      *(Integer *)((long)pvVar23 + lVar25 * 8) = pIVar24[lVar27];
      pIVar24[lVar27] = lVar25;
      lVar25 = lVar25 + 1;
    } while (local_f0 + 1 != lVar25);
  }
  p_Var29 = SPA;
  local_b0 = (Integer *)pvVar23;
  pvVar23 = malloc(SPA[lVar1].size * (long)pIVar9);
  if (local_a0 == 0) {
    local_e0 = (Integer *)0x1;
    local_110 = (Integer *)0x1;
    local_c0 = pIVar9;
  }
  else {
    local_e8 = (Integer *)0x1;
    local_110 = pIVar9;
    local_c8 = pIVar9;
  }
  if (0 < (long)local_b8) {
    pIVar34 = (Integer *)0x0;
    uVar28 = lVar35 - 0x3e9;
    local_d0 = pIVar24;
    do {
      p_Var29 = SPA;
      lVar35 = pIVar24[(long)pIVar34];
      if (lVar35 < 0) {
        pIVar34 = (Integer *)((long)pIVar34 + 1);
      }
      else {
        memset(pvVar23,0,SPA[lVar1].size * (long)pIVar9);
        local_98 = (Integer *)((long)pIVar34 + 1);
        do {
          pIVar34 = local_98;
          pIVar24 = local_98;
          if (local_a0 != 0) {
            pIVar34 = local_e8;
            local_e0 = local_98;
            pIVar24 = local_c8;
            local_c0 = local_98;
          }
          local_c8 = pIVar24;
          local_e8 = pIVar34;
          if (0 < p_Var29[lVar1].nblocks) {
            local_f0 = lVar35 * 2;
            lVar25 = lVar35 * 2 + 1;
            lVar27 = 0;
            do {
              IVar20 = local_60;
              pnga_sprs_array_column_distribution
                        (local_60,p_Var29[lVar1].blkidx[lVar27],&local_38,&local_40);
              if (local_80 == 4) {
                pnga_sprs_array_access_col_block(IVar20,lVar27,&local_88,&local_90,local_108);
                lVar26 = (long)*(int *)(local_88 + 4 + lVar35 * 4) -
                         (long)*(int *)(local_88 + lVar35 * 4);
                if (0 < (int)lVar26) {
                  lVar30 = 0;
                  do {
                    if (uVar28 < 0x10) {
                      lVar32 = *(int *)(local_88 + lVar35 * 4) + lVar30;
                      lVar31 = (long)*(int *)(local_90 + lVar32 * 4);
                      switch(uVar28) {
                      case 0:
                        piVar3 = (int *)((long)pvVar23 + lVar31 * 4);
                        *piVar3 = *piVar3 + *(int *)(local_108[0] + lVar32 * 4) *
                                            *(int *)((long)pvVar21 + lVar35 * 4);
                        break;
                      case 1:
                      case 0xf:
                        plVar2 = (long *)((long)pvVar23 + lVar31 * 8);
                        *plVar2 = *plVar2 + *(long *)(local_108[0] + lVar32 * 8) *
                                            *(long *)((long)pvVar21 + lVar35 * 8);
                        break;
                      case 2:
                        *(float *)((long)pvVar23 + lVar31 * 4) =
                             *(float *)((long)pvVar21 + lVar35 * 4) *
                             *(float *)(local_108[0] + lVar32 * 4) +
                             *(float *)((long)pvVar23 + lVar31 * 4);
                        break;
                      case 3:
                        *(double *)((long)pvVar23 + lVar31 * 8) =
                             *(double *)((long)pvVar21 + lVar35 * 8) *
                             *(double *)(local_108[0] + lVar32 * 8) +
                             *(double *)((long)pvVar23 + lVar31 * 8);
                        break;
                      case 5:
                        fVar5 = *(float *)((long)pvVar21 + lVar25 * 4);
                        uVar7 = *(undefined8 *)(local_108[0] + lVar32 * 8);
                        fVar6 = *(float *)((long)pvVar21 + local_f0 * 4);
                        fVar36 = (float)uVar7;
                        fVar37 = (float)((ulong)uVar7 >> 0x20);
                        uVar7 = *(undefined8 *)((long)pvVar23 + lVar31 * 8);
                        *(ulong *)((long)pvVar23 + lVar31 * 8) =
                             CONCAT44((float)((ulong)uVar7 >> 0x20) +
                                      fVar6 * fVar37 + fVar36 * fVar5,
                                      (float)uVar7 + fVar6 * fVar36 + fVar37 * -fVar5);
                        break;
                      case 6:
                        dVar10 = *(double *)((long)pvVar21 + lVar25 * 8);
                        pdVar4 = (double *)(local_108[0] + lVar32 * 0x10);
                        dVar15 = *pdVar4;
                        dVar16 = pdVar4[1];
                        dVar8 = *(double *)((long)pvVar21 + local_f0 * 8);
                        pdVar4 = (double *)((long)pvVar23 + lVar31 * 0x10);
                        dVar14 = pdVar4[1] + dVar8 * dVar16 + dVar15 * dVar10;
                        auVar12._8_4_ = SUB84(dVar14,0);
                        auVar12._0_8_ = *pdVar4 + dVar8 * dVar15 + dVar16 * -dVar10;
                        auVar12._12_4_ = (int)((ulong)dVar14 >> 0x20);
                        *(undefined1 (*) [16])((long)pvVar23 + lVar31 * 0x10) = auVar12;
                      }
                    }
                    lVar30 = lVar30 + 1;
                  } while (lVar26 != lVar30);
                }
              }
              else {
                pnga_sprs_array_access_col_block(IVar20,lVar27,&local_88,&local_90,local_108);
                lVar26 = *(long *)(local_88 + 8 + lVar35 * 8);
                lVar30 = *(long *)(local_88 + lVar35 * 8);
                if (lVar30 < lVar26) {
                  lVar31 = 0;
                  do {
                    if (uVar28 < 0x10) {
                      lVar33 = *(long *)(local_88 + lVar35 * 8) + lVar31;
                      lVar32 = *(long *)(local_90 + lVar33 * 8);
                      switch(uVar28) {
                      case 0:
                        piVar3 = (int *)((long)pvVar23 + lVar32 * 4);
                        *piVar3 = *piVar3 + *(int *)(local_108[0] + lVar33 * 4) *
                                            *(int *)((long)pvVar21 + lVar35 * 4);
                        break;
                      case 1:
                      case 0xf:
                        plVar2 = (long *)((long)pvVar23 + lVar32 * 8);
                        *plVar2 = *plVar2 + *(long *)(local_108[0] + lVar33 * 8) *
                                            *(long *)((long)pvVar21 + lVar35 * 8);
                        break;
                      case 2:
                        *(float *)((long)pvVar23 + lVar32 * 4) =
                             *(float *)((long)pvVar21 + lVar35 * 4) *
                             *(float *)(local_108[0] + lVar33 * 4) +
                             *(float *)((long)pvVar23 + lVar32 * 4);
                        break;
                      case 3:
                        *(double *)((long)pvVar23 + lVar32 * 8) =
                             *(double *)((long)pvVar21 + lVar35 * 8) *
                             *(double *)(local_108[0] + lVar33 * 8) +
                             *(double *)((long)pvVar23 + lVar32 * 8);
                        break;
                      case 5:
                        fVar5 = *(float *)((long)pvVar21 + lVar25 * 4);
                        uVar7 = *(undefined8 *)(local_108[0] + lVar33 * 8);
                        fVar6 = *(float *)((long)pvVar21 + local_f0 * 4);
                        fVar36 = (float)uVar7;
                        fVar37 = (float)((ulong)uVar7 >> 0x20);
                        uVar7 = *(undefined8 *)((long)pvVar23 + lVar32 * 8);
                        *(ulong *)((long)pvVar23 + lVar32 * 8) =
                             CONCAT44((float)((ulong)uVar7 >> 0x20) +
                                      fVar6 * fVar37 + fVar36 * fVar5,
                                      (float)uVar7 + fVar6 * fVar36 + fVar37 * -fVar5);
                        break;
                      case 6:
                        dVar10 = *(double *)((long)pvVar21 + lVar25 * 8);
                        pdVar4 = (double *)(local_108[0] + lVar33 * 0x10);
                        dVar15 = *pdVar4;
                        dVar16 = pdVar4[1];
                        dVar8 = *(double *)((long)pvVar21 + local_f0 * 8);
                        pdVar4 = (double *)((long)pvVar23 + lVar32 * 0x10);
                        dVar14 = pdVar4[1] + dVar8 * dVar16 + dVar15 * dVar10;
                        auVar13._8_4_ = SUB84(dVar14,0);
                        auVar13._0_8_ = *pdVar4 + dVar8 * dVar15 + dVar16 * -dVar10;
                        auVar13._12_4_ = (int)((ulong)dVar14 >> 0x20);
                        *(undefined1 (*) [16])((long)pvVar23 + lVar32 * 0x10) = auVar13;
                      }
                    }
                    lVar31 = lVar31 + 1;
                  } while (lVar26 - lVar30 != lVar31);
                }
              }
              lVar27 = lVar27 + 1;
              p_Var29 = SPA;
            } while (lVar27 < SPA[lVar1].nblocks);
          }
          pIVar34 = local_98;
          pIVar24 = local_d0;
          lVar35 = *(long *)((long)local_b0 + lVar35 * 8);
        } while (-1 < lVar35);
        switch(uVar28) {
        case 0:
          local_108[0] = CONCAT44(local_108[0]._4_4_,1);
          break;
        case 1:
        case 0xf:
          local_108[0] = 1;
          break;
        case 2:
          local_108[0] = CONCAT44(local_108[0]._4_4_,0x3f800000);
          break;
        case 3:
          local_108[0] = 0x3ff0000000000000;
          break;
        case 4:
        case 7:
        case 8:
        case 9:
        case 10:
        case 0xb:
        case 0xc:
        case 0xd:
        case 0xe:
          goto switchD_0014d148_caseD_4;
        case 5:
          local_108[0] = 0x3f800000;
          break;
        case 6:
          local_108[0] = 0x3ff0000000000000;
          local_108[1] = 0;
          break;
        default:
          goto switchD_0014d148_default;
        }
        pnga_acc(IVar19,(Integer *)&local_e8,(Integer *)&local_c8,pvVar23,(Integer *)&local_110,
                 local_108);
switchD_0014d148_caseD_4:
      }
switchD_0014d148_default:
      p_Var29 = SPA;
    } while (pIVar34 != local_b8);
  }
  pnga_pgroup_sync(p_Var29[lVar1].grp);
  free(pvVar23);
  free(local_a8);
  free(pvVar21);
  free(pIVar24);
  free(local_b0);
  return IVar19;
}

Assistant:

Integer pnga_sprs_array_count_sketch(Integer s_a, Integer size_k,
    Integer *g_k, Integer *g_w, Integer trans)
{
  Integer i, ii, j, jj, n, hdl, g_a;
  Integer nrows;
  hdl = s_a + GA_OFFSET;
  Integer *klabels;
  void *kweights;
  Integer idim, jdim;
  Integer dims[2];
  Integer one = 1;
  Integer two = 2;
  Integer nblocks[2];
  Integer *top;
  Integer *list;
  void *kbuf;
  Integer nprocs, me;
  Integer k, kk, kcnt;
  Integer idx_size;
  Integer type;
  Integer lo[2], hi[2], ld;
  Integer *map, *size;
  if (SPA[hdl].idim < size_k) {
    pnga_error("Row dimension of sketch matrix must be less than row"
        "dimension of original matrix",size_k);
  }
  /* accumulate operation does not support type C_LONGLONG so fail if this
   *    * data type encountered */
  if (SPA[hdl].type == C_LONGLONG) {
    pnga_error("Data type of sparse matrix"
        " cannot be of type long long",SPA[hdl].type);
  }
  /* how many rows do I own */
  nrows = SPA[hdl].ihi-SPA[hdl].ilo+1;
  idim = SPA[hdl].idim;
  jdim = SPA[hdl].jdim;
  idx_size = SPA[hdl].idx_size;
  type = SPA[hdl].type;
  nprocs = pnga_pgroup_nnodes(SPA[hdl].grp);
  me = pnga_pgroup_nodeid(SPA[hdl].grp);
  /* create map array */
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = nrows;
  if (idx_size == 4) {
    pnga_pgroup_gop(SPA[hdl].grp,C_INT,size,nprocs,"+");
  } else {
    pnga_pgroup_gop(SPA[hdl].grp,C_LONG,size,nprocs,"+");
  }
  map[0] = 1;
  for (i=1; i<nprocs; i++) {
    map[i] = map[i-1] + size[i-1];
  }
  map[nprocs] = 1;
  nblocks[0] = nprocs;
  nblocks[1] = 1;
  /* Assign each row to a label in the range  [0,size_k-1] */
  klabels = (Integer*)malloc(nrows*sizeof(Integer));
  for (i=0; i<nrows; i++) {
    klabels[i] = (Integer)(((double)size_k)*pnga_rand(0));
  }
  /* Assign each row a weight +/-1 */
  kweights = malloc(nrows*SPA[hdl].size);
  for (i=0; i<nrows; i++) {
    int val = (int)(2.0*pnga_rand(0));
    if (val == 0) {
      val = -1;
    } else {
      val = 1;
    }
    if (type == C_INT) {
      ((int*)kweights)[i] = val;
    } else if (type == C_LONG) {
      ((long*)kweights)[i] = (long)val;
    } else if (type == C_LONGLONG) {
      ((long long*)kweights)[i] = (long long)val;
    } else if (type == C_FLOAT) {
      ((float*)kweights)[i] = (float)val;
    } else if (type == C_DBL) {
      ((double*)kweights)[i] = (double)val;
    } else if (type == C_SCPL) {
      ((float*)kweights)[2*i] = (float)val;
      ((float*)kweights)[2*i+1] = 0.0;
    } else if (type == C_DCPL) {
      ((double*)kweights)[2*i] = (double)val;
      ((double*)kweights)[2*i+1] = 0.0;
    }
  }
  /* create distributed vectors to hold values in kweights and klabels */
  *g_w = pnga_create_handle();
  dims[0] = idim;
  pnga_set_data(*g_w,one,dims,SPA[hdl].type);
  pnga_set_irreg_distr(*g_w,map,nblocks);
  pnga_set_pgroup(*g_w,SPA[hdl].grp);
  pnga_allocate(*g_w);

  *g_k = pnga_create_handle();
  pnga_set_data(*g_k,one,dims,C_INT);
  pnga_set_irreg_distr(*g_k,map,nblocks);
  pnga_set_pgroup(*g_k,SPA[hdl].grp);
  pnga_allocate(*g_k);

  /* fill k-label and weight arrays */
  lo[0] = SPA[hdl].ilo+1; 
  hi[0] = SPA[hdl].ihi+1; 
  ld = nrows;
  kbuf = malloc(nrows*sizeof(int));
  for (i=0; i<nrows; i++) {
    ((int*)kbuf)[i] = (int)klabels[i];
  }
  pnga_put(*g_k,lo,hi,kbuf,&ld);
  free(kbuf);
  pnga_put(*g_w,lo,hi,kweights,&ld);
  pnga_pgroup_sync(SPA[hdl].grp);
  /* Create an output matrix of size_k by jdim */
  g_a = pnga_create_handle();
  if (trans) {
    dims[0] = jdim;
    dims[1] = size_k;
  } else {
    dims[0] = size_k;
    dims[1] = jdim;
  }
  pnga_set_data(g_a,two,dims,SPA[hdl].type);
  pnga_set_pgroup(g_a,SPA[hdl].grp);
  pnga_allocate(g_a);
  pnga_zero(g_a);

  /* create a linked list of rows that map to each k-index */
  top = (Integer*)malloc(size_k*sizeof(Integer));
  list = (Integer*)malloc(nrows*sizeof(Integer));
  for (i=0; i<size_k; i++) top[i] = -1;
  for (i=0; i<nrows; i++) {
    list[i] = top[klabels[i]];
    top[klabels[i]] = i;
  }
  
  /* loop over all values of k */
  kbuf = malloc(jdim*SPA[hdl].size);
  if (trans) {
    lo[0] = 1;
    hi[0] = jdim;
    ld = jdim;
  } else {
    lo[1] = 1;
    hi[1] = jdim;
    ld = 1;
  }
  for (kk = 0; kk<size_k; kk++) {
    /* accumulate all non-zero values that contribute to this value of k */
    if (top[kk] > -1) {
      Integer irow = top[kk];
      memset(kbuf,0,jdim*SPA[hdl].size);
      while (irow > -1) {
        /* loop over column blocks */
        if (trans) {
          lo[1] = kk+1;
          hi[1] = kk+1;
        } else {
          lo[0] = kk+1;
          hi[0] = kk+1;
        }
        for (n=0; n<SPA[hdl].nblocks; n++) {
          Integer nblk = SPA[hdl].blkidx[n];
          void *vptr;
          Integer jlo, jhi;
          pnga_sprs_array_column_distribution(s_a,nblk,&jlo,&jhi);
          if (idx_size == 4) {
            int *iptr;
            int *jptr;
            pnga_sprs_array_access_col_block(s_a,n,&iptr,&jptr,&vptr);
            Integer idx = irow;
            Integer kcols = iptr[idx+1]-iptr[idx];
            for (k = 0; k<kcols; k++) {
              Integer jdx = jptr[iptr[idx]+k];
              if (type == C_INT) {
                ((int*)kbuf)[jdx] += ((int*)kweights)[idx]*
                  ((int*)vptr)[iptr[idx]+k];
              } else if (type == C_LONG) {
                ((long*)kbuf)[jdx] += ((long*)kweights)[idx]*
                  ((long*)vptr)[iptr[idx]+k];
              } else if (type == C_LONGLONG) {
                ((long long*)kbuf)[jdx] += ((long long*)kweights)[idx]*
                  ((long long*)vptr)[iptr[idx]+k];
              } else if (type == C_FLOAT) {
                ((float*)kbuf)[jdx] += ((float*)kweights)[idx]*
                  ((float*)vptr)[iptr[idx]+k];
              } else if (type == C_DBL) {
                ((double*)kbuf)[jdx] += ((double*)kweights)[idx]*
                  ((double*)vptr)[iptr[idx]+k];
              } else if (type == C_SCPL) {
                float rw, iw, rv, iv;
                rw = ((float*)kweights)[2*idx];
                iw = ((float*)kweights)[2*idx+1];
                rv = ((float*)vptr)[2*(iptr[idx]+k)];
                iv = ((float*)vptr)[2*(iptr[idx]+k)+1];
                ((float*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((float*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              } else if (type == C_DCPL) {
                double rw, iw, rv, iv;
                rw = ((double*)kweights)[2*idx];
                iw = ((double*)kweights)[2*idx+1];
                rv = ((double*)vptr)[2*(iptr[idx]+k)];
                iv = ((double*)vptr)[2*(iptr[idx]+k)+1];
                ((double*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((double*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              }
            }
          } else {
            int64_t *iptr;
            int64_t *jptr;
            pnga_sprs_array_access_col_block(s_a,n,&iptr,&jptr,&vptr);
            Integer idx = irow;
            Integer kcols = iptr[idx+1]-iptr[idx];
            for (k = 0; k<kcols; k++) {
              Integer jdx = jptr[iptr[idx]+k];
              if (type == C_INT) {
                ((int*)kbuf)[jdx] += ((int*)kweights)[idx]*
                  ((int*)vptr)[iptr[idx]+k];
              } else if (type == C_LONG) {
                ((long*)kbuf)[jdx] += ((long*)kweights)[idx]*
                  ((long*)vptr)[iptr[idx]+k];
              } else if (type == C_LONGLONG) {
                ((long long*)kbuf)[jdx] += ((long long*)kweights)[idx]*
                  ((long long*)vptr)[iptr[idx]+k];
              } else if (type == C_FLOAT) {
                ((float*)kbuf)[jdx] += ((float*)kweights)[idx]*
                  ((float*)vptr)[iptr[idx]+k];
              } else if (type == C_DBL) {
                ((double*)kbuf)[jdx] += ((double*)kweights)[idx]*
                  ((double*)vptr)[iptr[idx]+k];
              } else if (type == C_SCPL) {
                float rw, iw, rv, iv;
                rw = ((float*)kweights)[2*idx];
                iw = ((float*)kweights)[2*idx+1];
                rv = ((float*)vptr)[2*(iptr[idx]+k)];
                iv = ((float*)vptr)[2*(iptr[idx]+k)+1];
                ((float*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((float*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              } else if (type == C_DCPL) {
                double rw, iw, rv, iv;
                rw = ((double*)kweights)[2*idx];
                iw = ((double*)kweights)[2*idx+1];
                rv = ((double*)vptr)[2*(iptr[idx]+k)];
                iv = ((double*)vptr)[2*(iptr[idx]+k)+1];
                ((double*)kbuf)[2*jdx] += rw*rv-iw*iv;
                ((double*)kbuf)[2*jdx+1] += rw*iv+iw*rv;
              }
            }
          }
        }
        irow = list[irow];
      }
      /* accumulate row into g_a */
      if (type == C_INT) {
        int ione = 1;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &ione);
      } else if (type == C_LONG) {
        long lone = 1;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &lone);
      } else if (type == C_LONGLONG) {
        long long llone = 1;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &llone);
      } else if (type == C_FLOAT) {
        float fone = 1.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &fone);
      } else if (type == C_DBL) {
        double done = 1.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &done);
      } else if (type == C_SCPL) {
        float cone[2];
        cone[0] = 1.0;
        cone[1] = 0.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &cone);
      } else if (type == C_DCPL) {
        double zone[2];
        zone[0] = 1.0;
        zone[1] = 0.0;
        pnga_acc(g_a, lo, hi, kbuf, &ld, &zone);
      }
    }
  }
  pnga_pgroup_sync(SPA[hdl].grp);

  /* free up arrays */
  free(kbuf);
  free(klabels);
  free(kweights);
  free(top);
  free(list);
  return g_a;
}